

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_init.c
# Opt level: O0

MPP_RET init_mvc_picture(H264_SLICE_t *currSlice)

{
  h264_dpb_buf_t *phVar1;
  h264_frame_store_t *phVar2;
  H264_StorePic_t *p;
  RK_S32 local_5c;
  RK_S32 local_58;
  RK_S32 local_54;
  H264_StorePic_t *p_clone;
  H264_FrameStore_t *fs;
  H264_StorePic_t *p_pic;
  H264_DpbBuf_t *p_Dpb;
  H264dVideoCtx_t *p_Vid;
  int local_20;
  MPP_RET ret;
  RK_S32 poc;
  RK_U32 i;
  H264_SLICE_t *currSlice_local;
  
  local_20 = 0;
  phVar1 = currSlice->p_Vid->p_Dpb_layer[0];
  fs = (H264_FrameStore_t *)0x0;
  if (currSlice->structure == 3) {
    for (ret = MPP_OK; (uint)ret < phVar1->used_size; ret = ret + ~MPP_ERR_UNKNOW) {
      phVar2 = phVar1->fs[(uint)ret];
      if (phVar2->frame != (h264_store_pic_t *)0x0) {
        if (phVar2->frame->is_mmco_5 == '\0') {
          local_54 = phVar2->frame->poc;
        }
        else {
          local_54 = phVar2->frame->poc_mmco5;
        }
        local_20 = local_54;
      }
      if (((phVar2->frame != (h264_store_pic_t *)0x0) && (phVar2->frame->layer_id == 0)) &&
         ((local_20 == currSlice->framepoc &&
          (fs = (H264_FrameStore_t *)phVar2->frame, phVar2->frame->is_mmco_5 == '\0')))) break;
    }
  }
  else if (currSlice->structure == 1) {
    for (ret = MPP_OK; (uint)ret < phVar1->used_size; ret = ret + ~MPP_ERR_UNKNOW) {
      phVar2 = phVar1->fs[(uint)ret];
      if (phVar2->top_field != (h264_store_pic_t *)0x0) {
        if (phVar2->top_field->is_mmco_5 == '\0') {
          local_58 = phVar2->top_field->top_poc;
        }
        else {
          local_58 = phVar2->top_field->top_poc_mmco5;
        }
        local_20 = local_58;
      }
      if (((phVar2->top_field != (h264_store_pic_t *)0x0) && (phVar2->top_field->layer_id == 0)) &&
         ((local_20 == currSlice->toppoc &&
          (fs = (H264_FrameStore_t *)phVar2->top_field, phVar2->top_field->is_mmco_5 == '\0'))))
      break;
    }
  }
  else {
    for (ret = MPP_OK; (uint)ret < phVar1->used_size; ret = ret + ~MPP_ERR_UNKNOW) {
      phVar2 = phVar1->fs[(uint)ret];
      if (phVar2->bottom_field != (h264_store_pic_t *)0x0) {
        if (phVar2->bottom_field->is_mmco_5 == '\0') {
          local_5c = phVar2->bottom_field->bottom_poc;
        }
        else {
          local_5c = phVar2->bottom_field->bot_poc_mmco5;
        }
        local_20 = local_5c;
      }
      if ((((phVar2->bottom_field != (h264_store_pic_t *)0x0) &&
           (phVar2->bottom_field->layer_id == 0)) && (local_20 == currSlice->bottompoc)) &&
         (fs = (H264_FrameStore_t *)phVar2->bottom_field, phVar2->bottom_field->is_mmco_5 == '\0'))
      break;
    }
  }
  if (fs == (H264_FrameStore_t *)0x0) {
LAB_001d2987:
    currSlice_local._4_4_ = MPP_OK;
  }
  else {
    p = clone_storable_picture(currSlice->p_Vid,(H264_StorePic_t *)fs);
    if (p == (H264_StorePic_t *)0x0) {
      p_Vid._4_4_ = MPP_ERR_MALLOC;
      if ((h264d_debug & 1) != 0) {
        _mpp_log_l(4,"h264d_init","malloc buffer error(%d).\n",(char *)0x0,0x174);
      }
    }
    else {
      p_Vid._4_4_ = store_proc_picture_in_dpb(currSlice->p_Dpb,p);
      if (MPP_NOK < p_Vid._4_4_) goto LAB_001d2987;
      if ((h264d_debug & 4) != 0) {
        _mpp_log_l(4,"h264d_init","Function error(%d).\n",(char *)0x0,0x175);
      }
    }
    currSlice_local._4_4_ = p_Vid._4_4_;
  }
  return currSlice_local._4_4_;
}

Assistant:

static MPP_RET init_mvc_picture(H264_SLICE_t *currSlice)
{
    RK_U32 i = 0;
    RK_S32 poc = 0;
    MPP_RET ret = MPP_ERR_UNKNOW;
    H264dVideoCtx_t *p_Vid = currSlice->p_Vid;
    H264_DpbBuf_t *p_Dpb = p_Vid->p_Dpb_layer[0];
    H264_StorePic_t *p_pic = NULL;
    H264_FrameStore_t *fs = NULL;
    H264_StorePic_t *p_clone = NULL;

    // find BL reconstructed picture
    if (currSlice->structure == FRAME) {
        for (i = 0; i < p_Dpb->used_size; i++) {
            fs = p_Dpb->fs[i];
            if (fs->frame) {
                poc = fs->frame->is_mmco_5 ? fs->frame->poc_mmco5 : fs->frame->poc;
            }
            if (fs->frame && (fs->frame->layer_id == 0) && (poc == currSlice->framepoc)) {
                p_pic = fs->frame;
                if (!fs->frame->is_mmco_5) {
                    break;
                }
            }
        }
    } else if (currSlice->structure == TOP_FIELD) {
        for (i = 0; i < p_Dpb->used_size; i++) {
            fs = p_Dpb->fs[i];
            if (fs->top_field) {
                poc = fs->top_field->is_mmco_5 ? fs->top_field->top_poc_mmco5 : fs->top_field->top_poc;
            }
            if (fs->top_field && (fs->top_field->layer_id == 0) && (poc == currSlice->toppoc)) {
                p_pic = fs->top_field;
                if (!fs->top_field->is_mmco_5) {
                    break;
                }
            }
        }
    } else {
        for (i = 0; i < p_Dpb->used_size; i++) {
            fs = p_Dpb->fs[i];
            if (fs->bottom_field) {
                poc = fs->bottom_field->is_mmco_5 ? fs->bottom_field->bot_poc_mmco5 : fs->bottom_field->bottom_poc;
            }
            if (fs->bottom_field && (fs->bottom_field->layer_id == 0) && (poc == currSlice->bottompoc)) {
                p_pic = fs->bottom_field;
                if (!fs->bottom_field->is_mmco_5) {
                    break;
                }
            }
        }
    }
    if (p_pic) {
        p_clone = clone_storable_picture(p_Vid, p_pic);
        MEM_CHECK(ret, p_clone);
        FUN_CHECK(ret = store_proc_picture_in_dpb(currSlice->p_Dpb, p_clone));
    }

    return ret = MPP_OK;
__FAILED:
    return ret;
}